

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive.cpp
# Opt level: O3

void __thiscall
SerializeArchiveNull_WriteTwoInts_Test::~SerializeArchiveNull_WriteTwoInts_Test
          (SerializeArchiveNull_WriteTwoInts_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (SerializeArchiveNull, WriteTwoInts) {
    pstore::serialize::archive::null writer;
    EXPECT_EQ (0U, writer.bytes_consumed ());
    writer.put (42);
    EXPECT_EQ (sizeof (int), writer.bytes_consumed ());
    writer.put (43);
    EXPECT_EQ (sizeof (int) * 2, writer.bytes_consumed ());
    EXPECT_EQ (sizeof (int) * 2, writer.bytes_produced ());
}